

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomOneAction.cpp
# Opt level: O2

ActionResults * __thiscall BlueRoomOneAction::Look(BlueRoomOneAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *pAVar4;
  itemType local_34;
  string local_30;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == TORCH) {
    local_34 = TORCH;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_34);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 != BACKPACK) {
      local_34 = TORCH;
      pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_34);
      ItemWrapper::setLocation(pIVar3,W_ROOM1);
      pAVar4 = (ActionResults *)operator_new(0x30);
      std::__cxx11::string::string
                ((string *)&local_30,
                 "One of the glass cases appears to be missing a back panel.You think you might be able to get a torch."
                 ,(allocator *)&local_34);
      ActionResults::ActionResults(pAVar4,CURRENT,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return pAVar4;
    }
  }
  pAVar4 = AbstractRoomAction::Look(&this->super_AbstractRoomAction);
  return pAVar4;
}

Assistant:

ActionResults *BlueRoomOneAction::Look() {
    if (commands->getMainItem() == TORCH && itemList->getValue(TORCH)->getLocation() != BACKPACK) {
        itemList->getValue(TORCH)->setLocation(W_ROOM1);
        return new ActionResults(CURRENT, "One of the glass cases appears to be missing a back panel."
                "You think you might be able to get a torch.");
    }
    return AbstractRoomAction::Look();
}